

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O2

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitIf
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,IfExpr e)

{
  double dVar1;
  ExprBase e_00;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  BasicStringRef<char> value_01;
  
  value.size_ = 3;
  value.data_ = "if ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value);
  Visit(this,(LogicalExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_ +
             8))->impl_,0);
  value_00.size_ = 6;
  value_00.data_ = " then ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value_00);
  e_00.impl_ = ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_
               + 0x18))->impl_;
  if ((e_00.impl_)->kind_ == 1) {
    dVar1 = *(double *)(e_00.impl_ + 2);
    Visit(this,(NumericExpr)
               ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_
               + 0x10))->impl_,2 - (uint)(dVar1 == 0.0));
    if ((dVar1 == 0.0) && (!NAN(dVar1))) {
      return;
    }
  }
  else {
    Visit(this,(NumericExpr)
               ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39>.super_ExprBase.impl_
               + 0x10))->impl_,2);
  }
  value_01.size_ = 6;
  value_01.data_ = " else ";
  fmt::BasicWriter<char>::operator<<(this->writer_,value_01);
  Visit(this,(NumericExpr)e_00.impl_,-1);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitIf(IfExpr e) {
  writer_ << "if ";
  Visit(e.condition(), prec::UNKNOWN);
  writer_ << " then ";
  NumericExpr else_expr = e.else_expr();
  bool has_else = !IsZero<ExprTypes>(else_expr);
  Visit(e.then_expr(), prec::CONDITIONAL + (has_else ? 1 : 0));
  if (has_else) {
    writer_ << " else ";
    Visit(else_expr);
  }
}